

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void get_tmfromtime(tm *tm,time_t *t)

{
  time_t *in_RSI;
  tm *in_RDI;
  
  tzset();
  localtime_r(in_RSI,in_RDI);
  return;
}

Assistant:

static void
get_tmfromtime(struct tm *tm, time_t *t)
{
#if HAVE_LOCALTIME_R
	tzset();
	localtime_r(t, tm);
#elif HAVE__LOCALTIME64_S
	_localtime64_s(tm, t);
#else
	memcpy(tm, localtime(t), sizeof(*tm));
#endif
}